

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::Impl::readEmbedFromSearchPath
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,Impl *this,PathPtr path)

{
  ReadableDirectory **ppRVar1;
  ReadableDirectory **ppRVar2;
  Maybe<kj::Array<const_unsigned_char>_> local_50;
  
  ppRVar2 = (this->searchPath).builder.ptr;
  ppRVar1 = (this->searchPath).builder.pos;
  if (ppRVar2 != ppRVar1) {
    do {
      readEmbed(&local_50,this,*ppRVar2,path);
      if (local_50.ptr.isSet != false) {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.ptr = local_50.ptr.field_1.value.ptr;
        (__return_storage_ptr__->ptr).field_1.value.size_ = local_50.ptr.field_1.value.size_;
        (__return_storage_ptr__->ptr).field_1.value.disposer = local_50.ptr.field_1.value.disposer;
        return __return_storage_ptr__;
      }
      ppRVar2 = ppRVar2 + 1;
    } while (ppRVar2 != ppRVar1);
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> ModuleLoader::Impl::readEmbedFromSearchPath(kj::PathPtr path) {
  for (auto candidate: searchPath) {
    KJ_IF_SOME(module, readEmbed(*candidate, path)) {
      return kj::mv(module);
    }
  }
  return kj::none;
}